

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

AstNode * parse_suffixed_expression(ParserState *parser)

{
  _Bool *p_Var1;
  int line;
  uint uVar2;
  int iVar3;
  LexerState *ls_00;
  C_MemoryAllocator *pCVar4;
  LexerState *ls_01;
  AstNode *pAVar5;
  AstNode *pAVar6;
  AstNode *ptr;
  StringObject *pSVar7;
  LexerState *ls;
  AstNode *node_1;
  AstNode *node;
  AstNode **self;
  AstNodeList **self_00;
  BinaryOperatorType ignored_1;
  BinaryOperatorType ignored;
  BinaryOperatorType ignored_2;
  BinaryOperatorType local_3c;
  BinaryOperatorType local_38;
  BinaryOperatorType local_34;
  
  ls_00 = parser->ls;
  line = ls_00->linenumber;
  uVar2 = ls_00->lastline;
  iVar3 = (ls_00->t).token;
  pCVar4 = parser->compiler_state->allocator;
  pAVar5 = (AstNode *)(*pCVar4->calloc)(pCVar4->arena,1,0x50);
  if (iVar3 == 0x111) {
    pAVar5->type = EXPR_BUILTIN;
    pAVar5->line_number = uVar2;
    p_Var1 = &(pAVar5->field_2).embedded_C_stmt.is_decl;
    *p_Var1 = (_Bool)(*p_Var1 & 0xfe);
    (pAVar5->field_2).common_expr.type.type_code = RAVI_TUSERDATA;
    (pAVar5->field_2).goto_stmt.name = (StringObject *)0x0;
    (pAVar5->field_2).unary_expr.unary_op = 0x111;
    (pAVar5->field_2).function_stmt.function_expr = (AstNode *)0x0;
    raviX_next(ls_00);
    checknext(ls_00,0x28);
    pAVar6 = parse_sub_expression(parser,0,&local_38);
    if ((pAVar6->type != EXPR_LITERAL) &&
       ((pAVar6->field_2).common_expr.type.type_code != RAVI_TSTRING)) {
      raviX_syntaxerror(ls_00,"Expected a size expression as second argument to C__new");
    }
    self = &(pAVar5->field_2).function_stmt.function_expr;
    checknext(ls_00,0x2c);
    ptr = parse_sub_expression(parser,0,&local_3c);
    if (ptr == (AstNode *)0x0) {
      raviX_syntaxerror(ls_00,"Expected a size expression as second argument to C__new");
    }
    checknext(ls_00,0x29);
    raviX_ptrlist_add((PtrList **)self,pAVar6,parser->compiler_state->allocator);
    raviX_ptrlist_add((PtrList **)self,ptr,parser->compiler_state->allocator);
    return pAVar5;
  }
  pAVar5->type = EXPR_SUFFIXED;
  pAVar5->line_number = uVar2;
  p_Var1 = &(pAVar5->field_2).embedded_C_stmt.is_decl;
  *p_Var1 = (_Bool)(*p_Var1 & 0xfe);
  (pAVar5->field_2).common_expr.type.type_code = RAVI_TANY;
  ls_01 = parser->ls;
  iVar3 = (ls_01->t).token;
  if (iVar3 == 0x12f) {
    pSVar7 = check_name_and_next(ls_01);
    pAVar6 = new_symbol_reference(parser,pSVar7);
  }
  else if (iVar3 == 0x28) {
    iVar3 = ls_01->linenumber;
    raviX_next(ls_01);
    pAVar6 = parse_sub_expression(parser,0,&local_34);
    p_Var1 = &(pAVar6->field_2).embedded_C_stmt.is_decl;
    *p_Var1 = (_Bool)(*p_Var1 | 1);
    check_match(ls_01,0x29,0x28,iVar3);
  }
  else {
    raviX_syntaxerror(ls_01,"unexpected symbol");
    pAVar6 = (AstNode *)0x0;
  }
  if (pAVar6 == (AstNode *)0x0) {
    __assert_fail("primary_expr",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/parser.c"
                  ,0x36f,"AstNode *parse_primary_expression(ParserState *)");
  }
  (pAVar5->field_2).function_stmt.function_expr = pAVar6;
  pSVar7 = (pAVar6->field_2).goto_stmt.name;
  (pAVar5->field_2).return_stmt.expr_list = (pAVar6->field_2).return_stmt.expr_list;
  (pAVar5->field_2).goto_stmt.name = pSVar7;
  self_00 = &(pAVar5->field_2).for_stmt.for_statement_list;
  (pAVar5->field_2).for_stmt.for_statement_list = (AstNodeList *)0x0;
LAB_001119db:
  do {
    iVar3 = (ls_00->t).token;
    if (iVar3 < 0x5b) {
      if (iVar3 == 0x28) goto LAB_00111a25;
      if (iVar3 == 0x2e) {
        pAVar6 = parse_field_selector(parser);
        goto LAB_00111a57;
      }
      if (iVar3 != 0x3a) {
        return pAVar5;
      }
      raviX_next(ls_00);
      pSVar7 = check_name_and_next(ls_00);
    }
    else {
      if (iVar3 == 0x5b) {
        pAVar6 = parse_yindex(parser);
LAB_00111a57:
        raviX_ptrlist_add((PtrList **)self_00,pAVar6,parser->compiler_state->allocator);
        (pAVar5->field_2).common_expr.type.type_code = RAVI_TANY;
        (pAVar5->field_2).goto_stmt.name = (StringObject *)0x0;
        goto LAB_001119db;
      }
      if ((iVar3 != 0x7b) && (iVar3 != 0x130)) {
        return pAVar5;
      }
LAB_00111a25:
      pSVar7 = (StringObject *)0x0;
    }
    pAVar6 = parse_function_call(parser,pSVar7,line);
    raviX_ptrlist_add((PtrList **)self_00,pAVar6,parser->compiler_state->allocator);
  } while( true );
}

Assistant:

static AstNode *parse_suffixed_expression(ParserState *parser)
{
	LexerState *ls = parser->ls;
	/* suffixedexp ->
	primaryexp { '.' NAME | '[' exp ']' | ':' NAME funcargs | funcargs } */
	int line = ls->linenumber;
	if (ls->t.token == TOK_C__new) {
		return parse_builtin_expression(parser, TOK_C__new);
	}
	AstNode *suffixed_expr = allocate_expr_ast_node(parser, EXPR_SUFFIXED);
	suffixed_expr->suffixed_expr.primary_expr = parse_primary_expression(parser);
	suffixed_expr->suffixed_expr.type = suffixed_expr->suffixed_expr.primary_expr->common_expr.type;
	suffixed_expr->suffixed_expr.suffix_list = NULL;
	for (;;) {
		switch (ls->t.token) {
		case '.': { /* fieldsel */
			AstNode *suffix = parse_field_selector(parser);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			set_type(&suffixed_expr->suffixed_expr.type, RAVI_TANY);
			break;
		}
		case '[': { /* '[' exp1 ']' */
			AstNode *suffix = parse_yindex(parser);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			set_type(&suffixed_expr->suffixed_expr.type, RAVI_TANY);
			break;
		}
		case ':': { /* ':' NAME funcargs */
			raviX_next(ls);
			const StringObject *methodname = check_name_and_next(ls);
			AstNode *suffix = parse_function_call(parser, methodname, line);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			break;
		}
		case '(':
		case TOK_STRING:
		case '{': { /* funcargs */
			AstNode *suffix = parse_function_call(parser, NULL, line);
			add_ast_node(parser->compiler_state, &suffixed_expr->suffixed_expr.suffix_list, suffix);
			break;
		}
		default:
			return suffixed_expr;
		}
	}
}